

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void load_GL_EXT_histogram(GLADloadproc load)

{
  GLADloadproc load_local;
  
  if (GLAD_GL_EXT_histogram != 0) {
    glad_glGetHistogramEXT = (PFNGLGETHISTOGRAMEXTPROC)(*load)("glGetHistogramEXT");
    glad_glGetHistogramParameterfvEXT =
         (PFNGLGETHISTOGRAMPARAMETERFVEXTPROC)(*load)("glGetHistogramParameterfvEXT");
    glad_glGetHistogramParameterivEXT =
         (PFNGLGETHISTOGRAMPARAMETERIVEXTPROC)(*load)("glGetHistogramParameterivEXT");
    glad_glGetMinmaxEXT = (PFNGLGETMINMAXEXTPROC)(*load)("glGetMinmaxEXT");
    glad_glGetMinmaxParameterfvEXT =
         (PFNGLGETMINMAXPARAMETERFVEXTPROC)(*load)("glGetMinmaxParameterfvEXT");
    glad_glGetMinmaxParameterivEXT =
         (PFNGLGETMINMAXPARAMETERIVEXTPROC)(*load)("glGetMinmaxParameterivEXT");
    glad_glHistogramEXT = (PFNGLHISTOGRAMEXTPROC)(*load)("glHistogramEXT");
    glad_glMinmaxEXT = (PFNGLMINMAXEXTPROC)(*load)("glMinmaxEXT");
    glad_glResetHistogramEXT = (PFNGLRESETHISTOGRAMEXTPROC)(*load)("glResetHistogramEXT");
    glad_glResetMinmaxEXT = (PFNGLRESETMINMAXEXTPROC)(*load)("glResetMinmaxEXT");
  }
  return;
}

Assistant:

static void load_GL_EXT_histogram(GLADloadproc load) {
	if(!GLAD_GL_EXT_histogram) return;
	glad_glGetHistogramEXT = (PFNGLGETHISTOGRAMEXTPROC)load("glGetHistogramEXT");
	glad_glGetHistogramParameterfvEXT = (PFNGLGETHISTOGRAMPARAMETERFVEXTPROC)load("glGetHistogramParameterfvEXT");
	glad_glGetHistogramParameterivEXT = (PFNGLGETHISTOGRAMPARAMETERIVEXTPROC)load("glGetHistogramParameterivEXT");
	glad_glGetMinmaxEXT = (PFNGLGETMINMAXEXTPROC)load("glGetMinmaxEXT");
	glad_glGetMinmaxParameterfvEXT = (PFNGLGETMINMAXPARAMETERFVEXTPROC)load("glGetMinmaxParameterfvEXT");
	glad_glGetMinmaxParameterivEXT = (PFNGLGETMINMAXPARAMETERIVEXTPROC)load("glGetMinmaxParameterivEXT");
	glad_glHistogramEXT = (PFNGLHISTOGRAMEXTPROC)load("glHistogramEXT");
	glad_glMinmaxEXT = (PFNGLMINMAXEXTPROC)load("glMinmaxEXT");
	glad_glResetHistogramEXT = (PFNGLRESETHISTOGRAMEXTPROC)load("glResetHistogramEXT");
	glad_glResetMinmaxEXT = (PFNGLRESETMINMAXEXTPROC)load("glResetMinmaxEXT");
}